

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O3

ssize_t kvtree_write_fd(char *file,int fd,kvtree *hash)

{
  size_t sVar1;
  size_t sVar2;
  size_t size;
  void *buf;
  size_t local_30;
  void *local_28;
  
  sVar2 = 0xffffffffffffffff;
  if ((hash != (kvtree *)0x0 && file != (char *)0x0) && -1 < fd) {
    kvtree_write_persist(&local_28,&local_30,hash);
    sVar1 = kvtree_write_attempt(file,fd,local_28,local_30);
    kvtree_free(&local_28);
    sVar2 = 0xffffffffffffffff;
    if (sVar1 == local_30) {
      sVar2 = sVar1;
    }
  }
  return sVar2;
}

Assistant:

ssize_t kvtree_write_fd(const char* file, int fd, const kvtree* hash)
{
  /* check that we have a hash, a file name, and a file descriptor */
  if (file == NULL || fd < 0 || hash == NULL) {
    return -1;
  }

  /* persist hash to buffer */
  void* buf;
  size_t size;
  kvtree_write_persist(&buf, &size, hash);

  /* write buffer to file */
  ssize_t nwrite = kvtree_write_attempt(file, fd, buf, size);

  /* free the pack buffer */
  kvtree_free(&buf);

  /* if we didn't write all of the bytes, return an error */
  if (nwrite != size) {
    return -1;
  }

  return nwrite;
}